

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompareDump.cpp
# Opt level: O3

void mysprint<char,std::char_traits<char>>
               (basic_ostream<char,_std::char_traits<char>_> *os,aiString *vec)

{
  ostream *poVar1;
  size_t sVar2;
  
  std::__ostream_insert<char,std::char_traits<char>>(os,"[length: \'",10);
  *(uint *)(os + *(long *)(*(long *)os + -0x18) + 0x18) =
       *(uint *)(os + *(long *)(*(long *)os + -0x18) + 0x18) & 0xffffffb5 | 2;
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)os);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\' content: \'",0xc);
  sVar2 = strlen(vec->data);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,vec->data,sVar2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\']",2);
  return;
}

Assistant:

void mysprint(std::basic_ostream<char_t, traits_t>& os,  const aiString& vec)   {
    os << "[length: \'" << std::dec << vec.length << "\' content: \'"  << vec.data << "\']";
}